

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<example::option_t,_std::allocator<example::option_t>_> * __thiscall
example::lazy<std::vector<example::option_t,_std::allocator<example::option_t>_>_>::get
          (lazy<std::vector<example::option_t,_std::allocator<example::option_t>_>_> *this)

{
  pointer poVar1;
  vector<example::option_t,_std::allocator<example::option_t>_> tmp;
  reader r;
  vector<example::option_t,_std::allocator<example::option_t>_> local_48;
  reader local_30;
  
  if ((this->val_).super_type.m_initialized == false) {
    local_30.buf_.data_ = (this->buf_).data_;
    local_30.buf_.size_ = (this->buf_).size_;
    local_30.opts_.super_type.m_initialized = false;
    local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    detail::reader::operator()(&local_30,&local_48);
    boost::optional_detail::
    optional_base<std::vector<example::option_t,_std::allocator<example::option_t>_>_>::assign
              (&(this->val_).super_type,&local_48);
    for (poVar1 = local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar1 != local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish; poVar1 = poVar1 + 1) {
      if ((poVar1->quote_ticks).super_optional<example::decimal_t>.super_type.m_initialized == true)
      {
        (poVar1->quote_ticks).super_optional<example::decimal_t>.super_type.m_initialized = false;
      }
    }
    if (local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<example::option_t,_std::allocator<example::option_t>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_30.opts_.super_type.m_initialized == true) {
      local_30.opts_.super_type.m_initialized = false;
    }
  }
  if ((this->val_).super_type.m_initialized != false) {
    return (vector<example::option_t,_std::allocator<example::option_t>_> *)
           &(this->val_).super_type.m_storage;
  }
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                "reference_type boost::optional<std::vector<example::option_t>>::get() [T = std::vector<example::option_t>]"
               );
}

Assistant:

T& lazy<T>::get() {
        if (!val_) {
            detail::reader r(buf_);
            T tmp;
            r(tmp);
            val_ = tmp;
        }
        return *val_;
    }